

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall pbrt::SceneRepresentation::ErrorExitDeferred<>(SceneRepresentation *this,char *fmt)

{
  long in_RDI;
  char *in_stack_00000020;
  
  *(undefined1 *)(in_RDI + 8) = 1;
  Error<>(in_stack_00000020);
  return;
}

Assistant:

void ErrorExitDeferred(const char *fmt, Args &&... args) const {
        errorExit = true;
        Error(fmt, std::forward<Args>(args)...);
    }